

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penalty_optimizer.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
penalty_optimizer::optimize
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,penalty_optimizer *this,
          vector<float,_std::allocator<float>_> *start_parameters)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  float fVar4;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  vector_utils local_c0 [24];
  _Vector_base<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> new_parameters;
  nelder_mead mead_optimizer;
  
  nelder_mead::nelder_mead
            (&mead_optimizer,
             (int)((ulong)((long)(start_parameters->
                                 super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(start_parameters->super__Vector_base<float,_std::allocator<float>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 2));
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,start_parameters);
  iVar2 = 10;
  do {
    bVar3 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if (bVar3) {
      poVar1 = log_info();
      poVar1 = std::operator<<(poVar1,"[Penalty optimizer] Maximum number of iterations reached (");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,10);
      poVar1 = std::operator<<(poVar1,").");
      std::endl<char,std::char_traits<char>>(poVar1);
      break;
    }
    (*(((this->_estimator).super___shared_ptr<penalty_error_estimator,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_error_estimator)._vptr_error_estimator[3])();
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_a8,__return_storage_ptr__);
    nelder_mead::optimize
              ((vector<float,_std::allocator<float>_> *)
               &new_parameters.super__Vector_base<float,_std::allocator<float>_>,&mead_optimizer,
               (vector<float,_std::allocator<float>_> *)&local_a8,
               &((this->_estimator).
                 super___shared_ptr<penalty_error_estimator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_error_estimator);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_a8);
    vector_utils::sub((vector<float,_std::allocator<float>_> *)&local_d8,__return_storage_ptr__,
                      (vector<float,_std::allocator<float>_> *)
                      &new_parameters.super__Vector_base<float,_std::allocator<float>_>);
    vector_utils::abs(local_c0,(int)&local_d8);
    fVar4 = vector_utils::sum((vector<float,_std::allocator<float>_> *)local_c0);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)local_c0);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
    std::vector<float,_std::allocator<float>_>::operator=
              (__return_storage_ptr__,
               (vector<float,_std::allocator<float>_> *)
               &new_parameters.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&new_parameters.super__Vector_base<float,_std::allocator<float>_>);
  } while (0.0001 <= fVar4);
  nelder_mead::~nelder_mead(&mead_optimizer);
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> penalty_optimizer::optimize(const std::vector<float>& start_parameters) const
{
  float penalty_value = 10.0f;
  const float penalty_multipler = 0.1f;

  nelder_mead mead_optimizer(start_parameters.size());

  auto current_parameters = start_parameters;
  const float acceptable_step_norm = 1e-4f;

  const int max_iterations = 10;
  int iteration = 0;

  for (; iteration < max_iterations; ++iteration)
  {
    _estimator->set_penalty_factor(penalty_value);
    auto new_parameters = mead_optimizer.optimize(current_parameters, _estimator.get());

    auto norm = vector_utils::sum(vector_utils::abs(vector_utils::sub(current_parameters, new_parameters)));
    
    current_parameters = new_parameters;

    if (norm < acceptable_step_norm)
    {
      break;
    }

    penalty_value *= penalty_multipler;
  }

  if (iteration >= max_iterations)
  {
    log_info() << "[Penalty optimizer] Maximum number of iterations reached (" << max_iterations << ")." << std::endl;
  }

  return current_parameters;
}